

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryAdd<FadCst<double>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,FadBinaryAdd<FadCst<double>,_Fad<Fad<double>_>_> *this
          )

{
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> FStack_28;
  
  FStack_28.fadexpr_.left_.constant_ = (this->left_).constant_;
  FStack_28.fadexpr_.right_ = &this->right_->val_;
  FStack_28.fadexpr_.left_.defaultVal = 0.0;
  Fad<double>::Fad<FadBinaryAdd<FadCst<double>,Fad<double>>>(__return_storage_ptr__,&FStack_28);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}